

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Operator(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,size_t t_precedence)

{
  Operator_Precedence OVar1;
  bool bVar2;
  undefined1 uVar3;
  eval_error *this_00;
  Depth_Counter dc;
  string oper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  File_Position local_108;
  Depth_Counter local_100;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong local_b8;
  
  Depth_Counter::Depth_Counter(&local_100,this);
  OVar1 = m_operators._M_elems[t_precedence];
  if (OVar1 == Prefix) {
    bVar2 = Value(this);
  }
  else {
    bVar2 = Operator(this,t_precedence + 1);
    if (bVar2) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_b8 = (ulong)OVar1;
      while( true ) {
        bVar2 = Operator_Helper(this,t_precedence,&local_f8);
        if (!bVar2) break;
        do {
          bVar2 = Eol(this);
        } while (bVar2);
        bVar2 = Operator(this,t_precedence + 1);
        if (!bVar2) {
          this_00 = (eval_error *)__cxa_allocate_exception(0x90);
          std::operator+(&local_d8,"Incomplete \'",&local_f8);
          std::operator+(&local_128,&local_d8,"\' expression");
          local_108.line = (this->m_position).line;
          local_108.column = (this->m_position).col;
          exception::eval_error::eval_error
                    (this_00,&local_128,&local_108,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        if (OVar1 < (Shift|Bitwise_Xor)) {
          uVar3 = (*(code *)(&DAT_003c5104 + *(int *)(&DAT_003c5104 + local_b8 * 4)))();
          return (bool)uVar3;
        }
      }
      std::__cxx11::string::~string((string *)&local_f8);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  (local_100.parser)->m_current_parse_depth = (local_100.parser)->m_current_parse_depth - 1;
  return bVar2;
}

Assistant:

bool Operator(const size_t t_precedence = 0) {
        Depth_Counter dc{this};
        bool retval = false;
        const auto prev_stack_top = m_match_stack.size();

        if (m_operators[t_precedence] != Operator_Precedence::Prefix) {
          if (Operator(t_precedence + 1)) {
            retval = true;
            std::string oper;
            while (Operator_Helper(t_precedence, oper)) {
              while (Eol()) {
              }
              if (!Operator(t_precedence + 1)) {
                throw exception::eval_error("Incomplete '" + oper + "' expression",
                                            File_Position(m_position.line, m_position.col),
                                            *m_filename);
              }

              switch (m_operators[t_precedence]) {
                case (Operator_Precedence::Ternary_Cond):
                  if (Symbol(":")) {
                    if (!Operator(t_precedence + 1)) {
                      throw exception::eval_error("Incomplete '" + oper + "' expression",
                                                  File_Position(m_position.line, m_position.col),
                                                  *m_filename);
                    }
                    build_match<eval::If_AST_Node<Tracer>>(prev_stack_top);
                  } else {
                    throw exception::eval_error("Incomplete '" + oper + "' expression",
                                                File_Position(m_position.line, m_position.col),
                                                *m_filename);
                  }
                  break;

                case (Operator_Precedence::Addition):
                case (Operator_Precedence::Multiplication):
                case (Operator_Precedence::Shift):
                case (Operator_Precedence::Equality):
                case (Operator_Precedence::Bitwise_And):
                case (Operator_Precedence::Bitwise_Xor):
                case (Operator_Precedence::Bitwise_Or):
                case (Operator_Precedence::Comparison):
                  build_match<eval::Binary_Operator_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;

                case (Operator_Precedence::Logical_And):
                  build_match<eval::Logical_And_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;
                case (Operator_Precedence::Logical_Or):
                  build_match<eval::Logical_Or_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;
                case (Operator_Precedence::Prefix):
                  assert(false); // cannot reach here because of if() statement at the top
                  break;

                  //                default:
                  //                  throw exception::eval_error("Internal error: unhandled ast_node",
                  //                  File_Position(m_position.line, m_position.col), *m_filename);
              }
            }
          }
        } else {
          return Value();
        }

        return retval;
      }